

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptDate.cpp
# Opt level: O3

Var Js::JavascriptDate::EntryValueOf(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  Var pvVar5;
  JavascriptDate *pJVar6;
  ScriptContext *pSVar7;
  double value;
  int in_stack_00000010;
  undefined1 local_40 [8];
  CallInfo callInfo_local;
  Var result;
  ArgumentReader args;
  
  pSVar7 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_40 = (undefined1  [8])callInfo;
  ThreadContext::ProbeStack(pSVar7->threadContext,0xc00,pSVar7,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x614,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) goto LAB_00bba145;
    *puVar4 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  pSVar7 = (ScriptContext *)local_40;
  result = (Var)callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&result,(CallInfo *)pSVar7);
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  if (((ulong)local_40 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    pSVar7 = (ScriptContext *)0x617;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x617,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) goto LAB_00bba145;
    *puVar4 = 0;
  }
  if (((ulong)result & 0xffffff) != 0) {
    pSVar7 = (ScriptContext *)0x0;
    pvVar5 = Arguments::operator[]((Arguments *)&result,0);
    bVar2 = VarIs<Js::JavascriptDate>(pvVar5);
    if (bVar2) {
      pvVar5 = Arguments::operator[]((Arguments *)&result,0);
      pJVar6 = VarTo<Js::JavascriptDate>(pvVar5);
      if (((ulong)result & 0xffffff) == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                    ,0x624,"(args.Info.Count > 0)","Negative argument count");
        if (!bVar2) {
LAB_00bba145:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      value = DateImplementation::GetMilliSeconds(&pJVar6->m_date);
      pvVar5 = JavascriptNumber::ToVarNoCheck(value,scriptContext);
      return pvVar5;
    }
  }
  callInfo_local = (CallInfo)0x0;
  BVar3 = TryInvokeRemotely(EntryValueOf,pSVar7,(Arguments *)&result,(Var *)&callInfo_local);
  if (BVar3 != 0) {
    return (Var)callInfo_local;
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec3d,L"Date.prototype.valueOf");
}

Assistant:

Var JavascriptDate::EntryValueOf(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0 || !VarIs<JavascriptDate>(args[0]))
        {
            Var result = nullptr;
            if (TryInvokeRemotely(EntryValueOf, scriptContext, args, &result))
            {
                return result;
            }
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedDate, _u("Date.prototype.valueOf"));
        }
        JavascriptDate* date = VarTo<JavascriptDate>(args[0]);

        AssertMsg(args.Info.Count > 0, "Negative argument count");
        double value = date->m_date.GetMilliSeconds();
        return JavascriptNumber::ToVarNoCheck(value, scriptContext);
    }